

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O2

void __thiscall Conversion::Conversion(Conversion *this,string *vocab)

{
  _Rb_tree_header *p_Var1;
  string sStack_38;
  
  (this->indexToChar)._M_dataplus._M_p = (pointer)&(this->indexToChar).field_2;
  (this->indexToChar)._M_string_length = 0;
  (this->indexToChar).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->charToIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&sStack_38,(string *)vocab);
  setVocab(this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

Conversion::Conversion(string vocab) {
    setVocab(std::move(vocab));
}